

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O3

void __thiscall
density_tests::LifoArrayOfTestObjects<8UL,_2UL>::check(LifoArrayOfTestObjects<8UL,_2UL> *this)

{
  TestObject<8UL,_2UL> *pTVar1;
  size_t sVar2;
  size_t i;
  long lVar3;
  TestObject<8UL,_2UL> *pTVar4;
  
  sVar2 = (this->m_array).super_LifoArrayImpl<density_tests::TestObject<8UL,_2UL>,_false>.m_size;
  if (sVar2 != 0) {
    pTVar4 = (this->m_array).super_LifoArrayImpl<density_tests::TestObject<8UL,_2UL>,_false>.
             m_elements;
    pTVar1 = pTVar4 + sVar2;
    do {
      lVar3 = 0;
      do {
        if ((pTVar4->m_storage).__data[lVar3] != '\b') {
          detail::assert_failed<>
                    ("storage[i] == s_fill_byte",
                     "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/../test_framework/test_objects.h"
                     ,0x89);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 8);
      pTVar4 = pTVar4 + 1;
    } while (pTVar4 != pTVar1);
  }
  return;
}

Assistant:

const_iterator end() const noexcept
        {
            return const_iterator(PrivateTag{}, m_elements + m_size);
        }